

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<void> __thiscall kj::anon_unknown_123::AsyncPipe::whenWriteDisconnected(AsyncPipe *this)

{
  SourceLocation location;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *t;
  ForkedPromise<void> *other;
  long in_RSI;
  undefined8 in_stack_ffffffffffffff20;
  SourceLocation local_a8;
  undefined1 local_90 [8];
  ForkedPromise<void> fork;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_70;
  SourceLocation local_58;
  undefined1 local_40 [8];
  PromiseFulfillerPair<void> paf;
  ForkedPromise<void> *p;
  ForkedPromise<void> *_p378;
  AsyncPipe *this_local;
  Promise<void> *result;
  
  if ((*(byte *)(in_RSI + 0x38) & 1) == 0) {
    paf.fulfiller.ptr =
         (PromiseFulfiller<void> *)
         kj::_::readMaybe<kj::ForkedPromise<void>>
                   ((Maybe<kj::ForkedPromise<void>_> *)(in_RSI + 0x50));
    if ((ForkedPromise<void> *)paf.fulfiller.ptr == (ForkedPromise<void> *)0x0) {
      SourceLocation::SourceLocation
                (&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,"whenWriteDisconnected",0x17d,0x12);
      location.function = (char *)local_58._16_8_;
      location.fileName = local_58.function;
      location.lineNumber = (int)in_stack_ffffffffffffff20;
      location.columnNumber = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
      newPromiseAndFulfiller<void>(location);
      t = mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
                    ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(&local_70,t);
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
                ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(in_RSI + 0x40),
                 &local_70);
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_70);
      SourceLocation::SourceLocation
                (&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,"whenWriteDisconnected",0x17f,0x13);
      Promise<void>::fork((Promise<void> *)local_90);
      ForkedPromise<void>::addBranch((ForkedPromise<void> *)this);
      other = mv<kj::ForkedPromise<void>>((ForkedPromise<void> *)local_90);
      Maybe<kj::ForkedPromise<void>_>::operator=
                ((Maybe<kj::ForkedPromise<void>_> *)(in_RSI + 0x50),other);
      ForkedPromise<void>::~ForkedPromise((ForkedPromise<void> *)local_90);
      PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_40);
    }
    else {
      ForkedPromise<void>::addBranch((ForkedPromise<void> *)this);
    }
  }
  else {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    if (readAborted) {
      return kj::READY_NOW;
    } else KJ_IF_SOME(p, readAbortPromise) {
      return p.addBranch();
    } else {
      auto paf = newPromiseAndFulfiller<void>();
      readAbortFulfiller = kj::mv(paf.fulfiller);
      auto fork = paf.promise.fork();
      auto result = fork.addBranch();
      readAbortPromise = kj::mv(fork);
      return result;
    }